

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

Iterator * __thiscall
kj::_::BTreeImpl::search(Iterator *__return_storage_ptr__,BTreeImpl *this,SearchKey *searchKey)

{
  NodeUnion *pNVar1;
  uint uVar2;
  uint uVar3;
  Parent *parent;
  Leaf *pLVar4;
  bool bVar5;
  
  uVar3 = this->height;
  uVar2 = 0;
  while( true ) {
    pNVar1 = this->tree;
    pLVar4 = (Leaf *)(pNVar1 + uVar2);
    bVar5 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar5) break;
    uVar2 = (*(code *)**(undefined8 **)searchKey)(searchKey,pLVar4);
    uVar2 = pLVar4->rows[(ulong)uVar2 + 6].i;
  }
  uVar3 = (**(code **)(*(long *)searchKey + 8))(searchKey,pLVar4);
  __return_storage_ptr__->tree = pNVar1;
  __return_storage_ptr__->leaf = pLVar4;
  __return_storage_ptr__->row = uVar3;
  return __return_storage_ptr__;
}

Assistant:

BTreeImpl::Iterator BTreeImpl::search(const SearchKey& searchKey) const {
  // Find the "first" row number (in sorted order) for which searchKey.isAfter(rowNumber) returns
  // false.

  uint pos = 0;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    auto& parent = tree[pos].parent;
    pos = parent.children[searchKey.search(parent)];
  }

  auto& leaf = tree[pos].leaf;
  return { tree, &leaf, searchKey.search(leaf) };
}